

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O0

void __thiscall
llvm::DWARFYAML::VisitorImpl<llvm::DWARFYAML::Data>::onVariableSizeValue
          (VisitorImpl<llvm::DWARFYAML::Data> *this,uint64_t U,uint Size)

{
  undefined4 in_register_00000014;
  uint Size_local;
  uint64_t U_local;
  VisitorImpl<llvm::DWARFYAML::Data> *this_local;
  
  switch(Size) {
  case 1:
    (*this->_vptr_VisitorImpl[10])
              (this,U & 0xff,CONCAT44(in_register_00000014,Size),CONCAT71(0x29846,(char)U));
    break;
  case 2:
    (*this->_vptr_VisitorImpl[0xb])
              (this,U & 0xffff,CONCAT44(in_register_00000014,Size),CONCAT62(0x298,(short)U));
    break;
  default:
    llvm_unreachable_internal
              ("Invalid integer write size.",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
               ,0x22);
  case 4:
    (*this->_vptr_VisitorImpl[0xc])(this,U & 0xffffffff);
    break;
  case 8:
    (*this->_vptr_VisitorImpl[0xd])(this,U,0);
  }
  return;
}

Assistant:

void DWARFYAML::VisitorImpl<T>::onVariableSizeValue(uint64_t U, unsigned Size) {
  switch (Size) {
  case 8:
    onValue((uint64_t)U);
    break;
  case 4:
    onValue((uint32_t)U);
    break;
  case 2:
    onValue((uint16_t)U);
    break;
  case 1:
    onValue((uint8_t)U);
    break;
  default:
    llvm_unreachable("Invalid integer write size.");
  }
}